

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Component.cpp
# Opt level: O0

string * __thiscall Component::QuotedName_abi_cxx11_(Component *this)

{
  string *in_RDI;
  allocator local_a9;
  string local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  string local_88 [15];
  char in_stack_ffffffffffffff87;
  Component *in_stack_ffffffffffffff88;
  allocator local_51;
  string local_50 [32];
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"\"",&local_51);
  NiceName_abi_cxx11_(in_stack_ffffffffffffff88,in_stack_ffffffffffffff87);
  std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"\"",&local_a9);
  std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return in_RDI;
}

Assistant:

std::string Component::QuotedName() const {
    return std::string("\"") + NiceName('.') + std::string("\"");
}